

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

string * __thiscall
helics::CommonCore::getExtractionUnits_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  char cVar1;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *puVar2;
  string *psVar3;
  
  puVar2 = getHandleInfo(this,handle);
  psVar3 = (string *)&gEmptyString_abi_cxx11_;
  if ((puVar2 != (unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)0x0
      ) && ((cVar1 = *(char *)((long)&puVar2[1]._M_t.
                                      super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                                      .super__Head_base<0UL,_helics::BrokerObject_*,_false>.
                                      _M_head_impl + 4), cVar1 == 'p' || (cVar1 == 'i')))) {
    psVar3 = (string *)(puVar2 + 10);
  }
  return psVar3;
}

Assistant:

const std::string& CommonCore::getExtractionUnits(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::INPUT:
            case InterfaceType::PUBLICATION:
                return handleInfo->units;
            default:
                break;
        }
    }
    return gEmptyString;
}